

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPizCompressor.cpp
# Opt level: O3

int __thiscall
Imf_2_5::PizCompressor::uncompress
          (PizCompressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  long *plVar1;
  int b;
  size_t __n;
  ushort uVar2;
  int i;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  ConstIterator CVar9;
  void *__s;
  void *__s_00;
  InputExc *pIVar10;
  unsigned_short *puVar11;
  uint b_00;
  ulong uVar12;
  unsigned_short *puVar13;
  long lVar14;
  uint a;
  long lVar15;
  int iVar16;
  ChannelData *pCVar17;
  int *__src;
  char *pcVar18;
  long lVar19;
  bool bVar20;
  
  if (inSize == 0) {
    *outPtr = this->_outBuffer;
    return 0;
  }
  iVar16 = (range->min).x;
  a = (range->min).y;
  iVar3 = (range->max).x;
  uVar5 = (range->max).y;
  b_00 = this->_maxY;
  if ((int)uVar5 < this->_maxY) {
    b_00 = uVar5;
  }
  b = this->_maxX;
  if (iVar3 < this->_maxX) {
    b = iVar3;
  }
  puVar13 = this->_tmpBuffer;
  cVar7._M_node = (_Base_ptr)ChannelList::begin(this->_channels);
  cVar8._M_node = (_Base_ptr)ChannelList::end(this->_channels);
  if (cVar7._M_node != cVar8._M_node) {
    lVar19 = 0x1c;
    do {
      pCVar17 = this->_channelData;
      *(unsigned_short **)((long)pCVar17 + lVar19 + -0x1c) = puVar13;
      *(unsigned_short **)((long)pCVar17 + lVar19 + -0x14) = puVar13;
      iVar3 = numSamples(*(int *)&cVar7._M_node[9].field_0x4,iVar16,b);
      *(int *)((long)pCVar17 + lVar19 + -0xc) = iVar3;
      iVar3 = numSamples(*(int *)&cVar7._M_node[9]._M_parent,a,b_00);
      *(int *)((long)pCVar17 + lVar19 + -8) = iVar3;
      *(undefined4 *)((long)pCVar17 + lVar19 + -4) = *(undefined4 *)&cVar7._M_node[9]._M_parent;
      iVar3 = pixelTypeSize(cVar7._M_node[9]._M_color);
      iVar4 = pixelTypeSize(HALF);
      *(int *)((long)&pCVar17->start + lVar19) = iVar3 / iVar4;
      puVar13 = puVar13 + (iVar3 / iVar4) * *(int *)((long)pCVar17 + lVar19 + -0xc) *
                          *(int *)((long)pCVar17 + lVar19 + -8);
      cVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar7._M_node);
      CVar9 = ChannelList::end(this->_channels);
      lVar19 = lVar19 + 0x20;
    } while ((const_iterator)cVar7._M_node != CVar9._i._M_node);
  }
  __s = operator_new__(0x2000);
  memset(__s,0,0x2000);
  if (inSize < 4) {
    pcVar18 = "PIZ compressed data too short";
  }
  else {
    if ((byte)inPtr[3] < 0x20) {
      iVar16 = (uint)(byte)inPtr[1] * 0x100 + (uint)(byte)*inPtr;
      __src = (int *)(inPtr + 4);
      uVar2 = CONCAT11(inPtr[3],inPtr[2]);
      if ((ushort)iVar16 <= uVar2) {
        uVar5 = (uint)uVar2 - iVar16;
        if (inPtr + inSize < (int *)((long)__src + (long)(int)uVar5 + 1)) {
          pIVar10 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::InputExc::InputExc(pIVar10,"PIZ compressed data too short");
          __cxa_throw(pIVar10,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
        }
        if (uVar5 != 0xffffffff) {
          memcpy((void *)((long)__s + (ulong)*(ushort *)inPtr),__src,(ulong)uVar5 + 1);
          __src = (int *)(inPtr + (ulong)uVar5 + 5);
        }
      }
      __s_00 = operator_new__(0x20000);
      iVar16 = 0;
      memset(__s_00,0,0x20000);
      uVar5 = 0;
      do {
        if ((uVar5 == 0) || ((*(byte *)((long)__s + (ulong)(uVar5 >> 3)) >> (uVar5 & 7) & 1) != 0))
        {
          lVar19 = (long)iVar16;
          iVar16 = iVar16 + 1;
          *(short *)((long)__s_00 + lVar19 * 2) = (short)uVar5;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != 0x10000);
      if (iVar16 < 0x10000) {
        memset((void *)((long)__s_00 + (long)iVar16 * 2),0,(ulong)(0xffff - iVar16) * 2 + 2);
      }
      if (inPtr + inSize < __src + 1) {
        pIVar10 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(pIVar10,"PIZ compressed data too short");
        __cxa_throw(pIVar10,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
      }
      if (inSize < *__src) {
        pIVar10 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc
                  (pIVar10,"Error in header for PIZ-compressed data (invalid array length).");
        __cxa_throw(pIVar10,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
      }
      hufUncompress((char *)(__src + 1),*__src,this->_tmpBuffer,
                    (int)((ulong)((long)puVar13 - (long)this->_tmpBuffer) >> 1));
      iVar3 = this->_numChans;
      if (0 < iVar3) {
        lVar19 = 0;
        do {
          uVar5 = this->_channelData[lVar19].size;
          uVar12 = (ulong)uVar5;
          if (0 < (int)uVar5) {
            pCVar17 = this->_channelData + lVar19;
            lVar15 = 0;
            lVar14 = 0;
            do {
              wav2Decode((unsigned_short *)((long)pCVar17->start + lVar15),pCVar17->nx,(int)uVar12,
                         pCVar17->ny,pCVar17->nx * (int)uVar12,(short)iVar16 - 1);
              lVar14 = lVar14 + 1;
              uVar12 = (ulong)pCVar17->size;
              lVar15 = lVar15 + 2;
            } while (lVar14 < (long)uVar12);
            iVar3 = this->_numChans;
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < iVar3);
      }
      puVar11 = this->_tmpBuffer;
      uVar5 = (uint)((ulong)((long)puVar13 - (long)puVar11) >> 1);
      if (0 < (int)uVar5) {
        uVar12 = 0;
        do {
          puVar11[uVar12] = *(unsigned_short *)((long)__s_00 + (ulong)puVar11[uVar12] * 2);
          uVar12 = uVar12 + 1;
        } while ((uVar5 & 0x7fffffff) != uVar12);
      }
      puVar13 = (unsigned_short *)this->_outBuffer;
      if (this->_format == XDR) {
        if ((int)a <= (int)b_00) {
          do {
            if (0 < iVar3) {
              lVar19 = 0;
              do {
                pCVar17 = this->_channelData;
                uVar5 = pCVar17[lVar19].ys;
                if ((int)a < 0) {
                  if (-1 < (int)uVar5) {
                    uVar6 = (uVar5 + ~a) / uVar5;
                    goto LAB_004451ab;
                  }
                  uVar6 = (~uVar5 - a) / -uVar5;
                }
                else if ((int)uVar5 < 0) {
                  uVar6 = a / -uVar5;
LAB_004451ab:
                  uVar6 = -uVar6;
                }
                else {
                  uVar6 = a / uVar5;
                }
                if ((a == uVar6 * uVar5) &&
                   (iVar16 = pCVar17[lVar19].size * pCVar17[lVar19].nx, 0 < iVar16)) {
                  puVar11 = pCVar17[lVar19].end;
                  uVar5 = iVar16 + 1;
                  do {
                    *puVar13 = *puVar11;
                    puVar13 = puVar13 + 1;
                    puVar11 = pCVar17[lVar19].end + 1;
                    pCVar17[lVar19].end = puVar11;
                    uVar5 = uVar5 - 1;
                  } while (1 < uVar5);
                  iVar3 = this->_numChans;
                }
                lVar19 = lVar19 + 1;
              } while (lVar19 < iVar3);
            }
            bVar20 = a != b_00;
            a = a + 1;
          } while (bVar20);
        }
      }
      else if ((int)a <= (int)b_00) {
        do {
          if (0 < iVar3) {
            lVar14 = 8;
            lVar19 = 0;
            do {
              pCVar17 = this->_channelData;
              uVar5 = *(uint *)((long)&pCVar17->nx + lVar14);
              if ((int)a < 0) {
                if (-1 < (int)uVar5) {
                  uVar6 = (~a + uVar5) / uVar5;
                  goto LAB_00445293;
                }
                uVar6 = (~uVar5 - a) / -uVar5;
              }
              else if ((int)uVar5 < 0) {
                uVar6 = a / -uVar5;
LAB_00445293:
                uVar6 = -uVar6;
              }
              else {
                uVar6 = a / uVar5;
              }
              if (a == uVar6 * uVar5) {
                lVar15 = (long)*(int *)((long)&pCVar17->ny + lVar14) *
                         (long)*(int *)((long)&pCVar17->end + lVar14);
                __n = lVar15 * 2;
                memcpy(puVar13,*(void **)((long)&pCVar17->start + lVar14),__n);
                puVar13 = puVar13 + lVar15;
                plVar1 = (long *)((long)&pCVar17->start + lVar14);
                *plVar1 = *plVar1 + __n;
                iVar3 = this->_numChans;
              }
              lVar19 = lVar19 + 1;
              lVar14 = lVar14 + 0x20;
            } while (lVar19 < iVar3);
          }
          bVar20 = a != b_00;
          a = a + 1;
        } while (bVar20);
      }
      pcVar18 = this->_outBuffer;
      *outPtr = pcVar18;
      operator_delete__(__s_00);
      operator_delete__(__s);
      return (int)puVar13 - (int)pcVar18;
    }
    pcVar18 = "Error in header for PIZ-compressed data (invalid bitmap size).";
  }
  pIVar10 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(pIVar10,pcVar18);
  __cxa_throw(pIVar10,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

int
PizCompressor::uncompress (const char *inPtr,
			   int inSize,
			   IMATH_NAMESPACE::Box2i range,
			   const char *&outPtr)
{
    //
    // This is the cunompress function which is used by both the tiled and
    // scanline decompression routines.
    //
   
    const char* inputEnd=inPtr+inSize;

    //
    // Special case - empty input buffer
    //

    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }


    //
    // Determine the layout of the compressed pixel data
    //

    int minX = range.min.x;
    int maxX = range.max.x;
    int minY = range.min.y;
    int maxY = range.max.y;
    
    if (maxY > _maxY)
        maxY = _maxY;
    
    if (maxX > _maxX)
        maxX = _maxX;

    unsigned short *tmpBufferEnd = _tmpBuffer;
    int i = 0;

    for (ChannelList::ConstIterator c = _channels.begin();
	 c != _channels.end();
	 ++c, ++i)
    {
	ChannelData &cd = _channelData[i];

	cd.start = tmpBufferEnd;
	cd.end = cd.start;

	cd.nx = numSamples (c.channel().xSampling, minX, maxX);
	cd.ny = numSamples (c.channel().ySampling, minY, maxY);
	cd.ys = c.channel().ySampling;

	cd.size = pixelTypeSize (c.channel().type) / pixelTypeSize (HALF);

	tmpBufferEnd += cd.nx * cd.ny * cd.size;
    }

    //
    // Read range compression data
    //

    unsigned short minNonZero;
    unsigned short maxNonZero;

    AutoArray <unsigned char, BITMAP_SIZE> bitmap;
    memset (bitmap, 0, sizeof (unsigned char) * BITMAP_SIZE);


    if(inPtr + sizeof(unsigned short)*2 > inputEnd)
    {
   	   throw InputExc ("PIZ compressed data too short");
    }

    Xdr::read <CharPtrIO> (inPtr, minNonZero);
    Xdr::read <CharPtrIO> (inPtr, maxNonZero);

    if (maxNonZero >= BITMAP_SIZE)
    {
	throw InputExc ("Error in header for PIZ-compressed data "
			"(invalid bitmap size).");
    }

    if (minNonZero <= maxNonZero)
    {
        size_t bytesToRead = maxNonZero - minNonZero + 1;
	    if(inPtr + bytesToRead > inputEnd)
        {
   	      throw InputExc ("PIZ compressed data too short");
        }

Xdr::read <CharPtrIO> (inPtr, (char *) &bitmap[0] + minNonZero,
			       bytesToRead);
    }

    AutoArray <unsigned short, USHORT_RANGE> lut;
    unsigned short maxValue = reverseLutFromBitmap (bitmap, lut);

    //
    // Huffman decoding
    //
   if(inPtr + sizeof(int)> inputEnd)
   {
       throw InputExc ("PIZ compressed data too short");
   }


    int length;
    Xdr::read <CharPtrIO> (inPtr, length);

    if (length > inSize)
    {
	throw InputExc ("Error in header for PIZ-compressed data "
			"(invalid array length).");
    }

    hufUncompress (inPtr, length, _tmpBuffer, tmpBufferEnd - _tmpBuffer);

    //
    // Wavelet decoding
    //

    for (int i = 0; i < _numChans; ++i)
    {
	ChannelData &cd = _channelData[i];

	for (int j = 0; j < cd.size; ++j)
	{
	    wav2Decode (cd.start + j,
			cd.nx, cd.size,
			cd.ny, cd.nx * cd.size,
			maxValue);
	}
    }

    //
    // Expand the pixel data to their original range
    //

    applyLut (lut, _tmpBuffer, tmpBufferEnd - _tmpBuffer);
    
    //
    // Rearrange the pixel data into the format expected by the caller.
    //

    char *outEnd = _outBuffer;

    if (_format == XDR)
    {
	//
	// Machine-independent (Xdr) data format
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		for (int x = cd.nx * cd.size; x > 0; --x)
		{
		    Xdr::write <CharPtrIO> (outEnd, *cd.end);
		    ++cd.end;
		}
	    }
	}
    }
    else
    {
	//
	// Native, machine-dependent data format
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		int n = cd.nx * cd.size;
		memcpy (outEnd, cd.end, n * sizeof (unsigned short));
		outEnd += n * sizeof (unsigned short);
		cd.end += n;
	    }
	}
    }

    #if defined (DEBUG)

	for (int i = 1; i < _numChans; ++i)
	    assert (_channelData[i-1].end == _channelData[i].start);

	assert (_channelData[_numChans-1].end == tmpBufferEnd);

    #endif

    outPtr = _outBuffer;
    return outEnd - _outBuffer;
}